

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O2

bool __thiscall
StringKMerFactoryNC::create_kmers
          (StringKMerFactoryNC *this,string *s,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *mers)

{
  uint64_t *rkmer;
  ulong uVar1;
  
  rkmer = &(this->super_KMerFactory).fkmer;
  (this->super_KMerFactory).rkmer = 0;
  (this->super_KMerFactory).last_unknown = 0;
  (this->super_KMerFactory).fkmer = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (mers,((long)(mers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(mers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 3) + s->_M_string_length);
  for (uVar1 = 0; uVar1 < s->_M_string_length; uVar1 = uVar1 + 1) {
    KMerFactory::fillKBuf
              (&this->super_KMerFactory,(s->_M_dataplus)._M_p[uVar1],rkmer,
               &(this->super_KMerFactory).rkmer,&(this->super_KMerFactory).last_unknown);
    if ((long)(ulong)(this->super_KMerFactory).K <= (this->super_KMerFactory).last_unknown) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)mers,rkmer);
    }
  }
  return false;
}

Assistant:

const bool create_kmers(const std::string &s, std::vector<uint64_t> &mers) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        mers.reserve(mers.size()+s.size());
        while (p < s.size()) {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                mers.emplace_back(fkmer);
            }
        }
        return false;
    }